

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakHash.c
# Opt level: O3

HashReturn Keccak_HashUpdate(Keccak_HashInstance *instance,BitSequence *data,BitLength databitlen)

{
  sbyte sVar1;
  HashReturn HVar2;
  uint uVar3;
  ulong uVar4;
  uchar oneByte [1];
  byte local_29;
  
  uVar4 = databitlen & 7;
  HVar2 = KeccakWidth1600_SpongeAbsorb(&instance->sponge,data,databitlen >> 3);
  if (HVar2 == KECCAK_SUCCESS && uVar4 != 0) {
    sVar1 = ((byte)uVar4 < 0x21) * (' ' - (byte)uVar4);
    uVar3 = (uint)instance->delimitedSuffix << (int)uVar4;
    local_29 = (byte)(((uint)data[databitlen >> 3] << sVar1) >> sVar1) | (byte)uVar3;
    if (uVar3 < 0x100) {
      instance->delimitedSuffix = local_29;
      HVar2 = KECCAK_SUCCESS;
    }
    else {
      HVar2 = KeccakWidth1600_SpongeAbsorb(&instance->sponge,&local_29,1);
      instance->delimitedSuffix = (uchar)(uVar3 >> 8);
    }
  }
  return HVar2;
}

Assistant:

HashReturn Keccak_HashUpdate(Keccak_HashInstance *instance, const BitSequence *data, BitLength databitlen)
{
    if ((databitlen % 8) == 0)
        return (HashReturn)KeccakWidth1600_SpongeAbsorb(&instance->sponge, data, databitlen/8);
    else {
        HashReturn ret = (HashReturn)KeccakWidth1600_SpongeAbsorb(&instance->sponge, data, databitlen/8);
        if (ret == KECCAK_SUCCESS) {
            /* The last partial byte is assumed to be aligned on the least significant bits */
            unsigned char lastByte = data[databitlen/8];
            /* Concatenate the last few bits provided here with those of the suffix */
            unsigned short delimitedLastBytes = (unsigned short)((unsigned short)(lastByte & ((1 << (databitlen % 8)) - 1)) | ((unsigned short)instance->delimitedSuffix << (databitlen % 8)));
            if ((delimitedLastBytes & 0xFF00) == 0x0000) {
                instance->delimitedSuffix = delimitedLastBytes & 0xFF;
            }
            else {
                unsigned char oneByte[1];
                oneByte[0] = delimitedLastBytes & 0xFF;
                ret = (HashReturn)KeccakWidth1600_SpongeAbsorb(&instance->sponge, oneByte, 1);
                instance->delimitedSuffix = (delimitedLastBytes >> 8) & 0xFF;
            }
        }
        return ret;
    }
}